

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock.cc
# Opt level: O1

reusable_block_list fdb_get_reusable_block(fdb_kvs_handle *handle,stale_header_info stale_header)

{
  avl_tree *mergetree;
  btreeblk_handle *pbVar1;
  bool bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  list_elem *e;
  size_t sVar6;
  undefined8 uVar7;
  btree_result bVar8;
  avl_node *paVar9;
  avl_node *paVar10;
  avl_node *paVar11;
  int64_t iVar12;
  list *plVar13;
  list_elem *plVar14;
  avl_node *paVar15;
  avl_node *paVar16;
  long *plVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  avl_node *node;
  ulong uVar21;
  uint uVar22;
  bid_t bVar23;
  reusable_block_list rVar24;
  ulong local_200;
  reusable_block *local_1f0;
  avl_node *local_1e8;
  filemgr_header_revnum_t _revnum;
  avl_node *local_1d0;
  avl_node *local_1c8;
  avl_node *local_1c0;
  list_elem *local_1b8;
  bid_t prev_hdr;
  bid_t prev_offset;
  bid_t _offset;
  docio_object doc;
  stale_regions local_148;
  btree_iterator bit;
  kvs_stat stat;
  uint8_t keybuf [64];
  
  paVar15 = (avl_node *)stale_header.revnum;
  prev_hdr = 0xffffffffffffffff;
  doc.length.keylen = 0;
  doc.length.metalen = 0;
  doc.length.bodylen = 0;
  doc.length.bodylen_ondisk = 0;
  doc.length.flag = '\0';
  doc.length.checksum = '\0';
  doc.length.reserved = 0;
  doc._16_8_ = doc._16_8_ & 0xffffffff00000000;
  doc.key = (void *)0x0;
  doc.field_3.seqnum = 0;
  doc.meta = (void *)0x0;
  doc.body = (void *)0x0;
  mergetree = &handle->file->mergetree;
  _kvs_stat_get(handle->file,0,&stat);
  pbVar1 = handle->bhandle;
  pbVar1->nlivenodes = stat.nlivenodes;
  pbVar1->ndeltanodes = stat.nlivenodes;
  local_1e8 = (avl_node *)calloc(0x100,8);
  local_1b8 = handle->file->stale_list->tail;
  paVar9 = avl_first(&handle->file->stale_info_tree);
  local_1d0 = paVar15;
  if (paVar9 == (avl_node *)0x0) {
    local_1c8 = (avl_node *)0x0;
    uVar21 = 0;
    uVar20 = 0x100;
  }
  else {
    paVar10 = avl_next(paVar9);
    paVar16 = paVar9[1].parent;
    if (paVar15 < paVar16) {
      local_1c8 = (avl_node *)0x0;
      bVar3 = true;
      uVar21 = 0;
      uVar20 = 0x100;
    }
    else {
      local_200 = 0x100;
      uVar21 = 0;
      node = paVar9;
      do {
        uVar22 = (int)uVar21 + 1;
        (&local_1e8->parent)[uVar21] = paVar16;
        paVar11 = local_1e8;
        local_1c8 = paVar16;
        local_1c0 = paVar10;
        if ((uint)local_200 <= uVar22) {
          local_200 = (ulong)((uint)local_200 * 2);
          paVar11 = (avl_node *)realloc(local_1e8,local_200 * 8);
        }
        bVar3 = paVar11 != (avl_node *)0x0;
        if (paVar11 == (avl_node *)0x0) {
          fdb_log_impl((err_log_callback *)0x0,2,FDB_RESULT_ALLOC_FAIL,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/staleblock.cc"
                       ,"fdb_get_reusable_block",0x298,
                       "(fdb_get_reusable_block) realloc of \'revnum_array\' failed: database file \'%s\', max_revnum_array %d\n"
                       ,handle->file->filename,local_200);
          node = local_1e8;
        }
        else {
          avl_remove(&handle->file->stale_info_tree,node);
          paVar15 = local_1d0;
          local_1e8 = paVar11;
          if (node[1].left != (avl_node *)0x0) {
            paVar16 = node[1].left;
            do {
              paVar10 = paVar16->left;
              list_remove((list *)&node[1].left,(list_elem *)paVar16);
              if (paVar16->right != (avl_node *)0x0) {
                _fetch_stale_info_doc(paVar16->right,mergetree,&prev_offset,&prev_hdr);
              }
              filemgr_actual_stale_regions
                        ((stale_regions *)&bit,handle->file,(bid_t)paVar16[1].parent,
                         (size_t)paVar16[1].left);
              bVar23 = bit.btree.root_bid;
              uVar7 = bit.btree._0_8_;
              if ((ulong)bit.btree._0_8_ < 2) {
                _insert_n_merge(mergetree,bit.btree.root_bid,(uint32_t)bit.btree.blk_handle);
              }
              else {
                uVar21 = 0;
                uVar20 = 1;
                do {
                  _insert_n_merge(mergetree,*(uint64_t *)(bVar23 + uVar21 * 0x28),
                                  *(uint32_t *)(bVar23 + 8 + uVar21 * 0x28));
                  bVar2 = uVar20 < (ulong)uVar7;
                  uVar21 = uVar20;
                  uVar20 = (ulong)((int)uVar20 + 1);
                } while (bVar2);
                free((void *)bVar23);
              }
              free(paVar16->right);
              free(paVar16);
              paVar15 = local_1d0;
              paVar16 = paVar10;
            } while (paVar10 != (avl_node *)0x0);
          }
        }
        uVar21 = (ulong)uVar22;
        free(node);
        node = local_1c0;
        uVar20 = local_200;
        if ((paVar11 == (avl_node *)0x0) || (local_1c0 == (avl_node *)0x0)) break;
        paVar10 = avl_next(local_1c0);
        paVar16 = node[1].parent;
      } while (paVar16 <= paVar15);
    }
    local_200 = 0;
    local_1f0 = (reusable_block *)0x0;
    if (!bVar3) goto LAB_0013db56;
  }
  local_200 = uVar20;
  uVar22 = (uint)uVar21;
  if (paVar9 == (avl_node *)0x0) {
    btree_iterator_init(handle->staletree,&bit,(void *)0x0);
    bVar8 = btree_next(&bit,&_revnum,&_offset);
    btreeblk_end(handle->bhandle);
    if ((bVar8 == BTREE_RESULT_SUCCESS) &&
       (paVar15 = (avl_node *)
                  (_revnum >> 0x38 | (_revnum & 0xff000000000000) >> 0x28 |
                   (_revnum & 0xff0000000000) >> 0x18 | (_revnum & 0xff00000000) >> 8 |
                   (_revnum & 0xff000000) << 8 | (_revnum & 0xff0000) << 0x18 |
                   (_revnum & 0xff00) << 0x28 | _revnum << 0x38), paVar15 <= local_1d0)) {
      do {
        uVar22 = (int)uVar21 + 1;
        (&local_1e8->parent)[uVar21] = paVar15;
        local_1c8 = paVar15;
        if ((uint)local_200 <= uVar22) {
          local_200 = (ulong)((uint)local_200 * 2);
          local_1e8 = (avl_node *)realloc(local_1e8,local_200 * 8);
        }
        if (_offset != 0xffffffffffffffff) {
          bVar23 = _offset >> 0x38 | (_offset & 0xff000000000000) >> 0x28 |
                   (_offset & 0xff0000000000) >> 0x18 | (_offset & 0xff00000000) >> 8 |
                   (_offset & 0xff000000) << 8 | (_offset & 0xff0000) << 0x18 |
                   (_offset & 0xff00) << 0x28 | _offset << 0x38;
          do {
            doc.timestamp = 0;
            doc._20_4_ = 0;
            doc.field_3.seqnum = 0;
            doc.meta = (void *)0x0;
            doc.length.keylen = 0;
            doc.length.metalen = 0;
            doc.length.bodylen = 0;
            doc.length.bodylen_ondisk = 0;
            doc.length.flag = '\0';
            doc.length.checksum = '\0';
            doc.length.reserved = 0;
            doc.body = (void *)0x0;
            doc.key = keybuf;
            iVar12 = docio_read_doc(handle->dhandle,bVar23,&doc,true);
            if (iVar12 < 1) {
              bVar23 = 0xffffffffffffffff;
            }
            else {
              _fetch_stale_info_doc(doc.body,mergetree,&prev_offset,&prev_hdr);
              filemgr_actual_stale_regions
                        (&local_148,handle->file,bVar23,
                         (ulong)((doc.length._0_4_ & 0xffff) + ((uint)doc.length._0_4_ >> 0x10) +
                                doc.length.bodylen_ondisk) + 0x20);
              uVar7 = local_148.field_1.regions;
              sVar6 = local_148.n_regions;
              if (local_148.n_regions < 2) {
                _insert_n_merge(mergetree,local_148.field_1.region.pos,local_148.field_1.region.len)
                ;
              }
              else {
                uVar21 = 0;
                uVar20 = 1;
                do {
                  _insert_n_merge(mergetree,((stale_data *)(uVar7 + uVar21 * 0x28))->pos,
                                  ((stale_data *)(uVar7 + uVar21 * 0x28))->len);
                  bVar3 = uVar20 < sVar6;
                  uVar21 = uVar20;
                  uVar20 = (ulong)((int)uVar20 + 1);
                } while (bVar3);
                free((void *)uVar7);
              }
              free(doc.body);
              bVar23 = prev_offset;
            }
          } while (bVar23 != 0xffffffffffffffff);
        }
        bVar8 = btree_next(&bit,&_revnum,&_offset);
        btreeblk_end(handle->bhandle);
        if (bVar8 != BTREE_RESULT_SUCCESS) break;
        paVar15 = (avl_node *)
                  (_revnum >> 0x38 | (_revnum & 0xff000000000000) >> 0x28 |
                   (_revnum & 0xff0000000000) >> 0x18 | (_revnum & 0xff00000000) >> 8 |
                   (_revnum & 0xff000000) << 8 | (_revnum & 0xff0000) << 0x18 |
                   (_revnum & 0xff00) << 0x28 | _revnum << 0x38);
        uVar21 = (ulong)uVar22;
      } while (paVar15 <= local_1d0);
    }
    btree_iterator_free(&bit);
  }
  if (uVar22 != 0) {
    uVar21 = 0;
    do {
      paVar15 = (&local_1e8->parent)[uVar21];
      _revnum = (ulong)paVar15 >> 0x38 | ((ulong)paVar15 & 0xff000000000000) >> 0x28 |
                ((ulong)paVar15 & 0xff0000000000) >> 0x18 | ((ulong)paVar15 & 0xff00000000) >> 8 |
                ((ulong)paVar15 & 0xff000000) << 8 | ((ulong)paVar15 & 0xff0000) << 0x18 |
                ((ulong)paVar15 & 0xff00) << 0x28 | (long)paVar15 << 0x38;
      btree_remove(handle->staletree,&_revnum);
      btreeblk_end(handle->bhandle);
      uVar21 = uVar21 + 1;
    } while (uVar22 != uVar21);
  }
  _kvs_stat_update_attr
            (handle->file,0,KVS_STAT_NLIVENODES,handle->bhandle->nlivenodes - stat.nlivenodes);
  _kvs_stat_update_attr
            (handle->file,0,KVS_STAT_DELTASIZE,
             (ulong)(handle->config).blocksize * (handle->bhandle->ndeltanodes - stat.nlivenodes));
  if (local_1b8 == (list_elem *)0x0) {
    plVar13 = handle->file->stale_list;
  }
  else {
    plVar13 = (list *)&local_1b8->next;
  }
  e = plVar13->head;
  while (e != (list_elem *)0x0) {
    plVar14 = list_remove(handle->file->stale_list,e);
    _insert_n_merge(mergetree,(uint64_t)e[-1].prev,*(uint32_t *)&e[-1].next);
    free(e + -1);
    e = plVar14;
  }
  uVar22 = handle->file->blocksize;
  uVar21 = CONCAT44(0,uVar22);
  local_1f0 = (reusable_block *)calloc(0x100,0x10);
  paVar15 = avl_first(mergetree);
  if (paVar15 == (avl_node *)0x0) {
    local_200 = 0;
  }
  else {
    local_200 = 0;
    paVar9 = (avl_node *)0x100;
    do {
      while( true ) {
        paVar16 = avl_next(paVar15);
        if (uVar22 <= *(uint *)&paVar15[-1].right) break;
LAB_0013d9ff:
        paVar15 = paVar16;
        if (paVar16 == (avl_node *)0x0) goto LAB_0013db1a;
      }
      uVar20 = 0;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar21;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = paVar15[-1].left;
      if (SUB168(auVar5 % auVar4,0) != 0) {
        uVar20 = (ulong)(uVar22 - SUB164(auVar5 % auVar4,0));
      }
      iVar19 = (int)uVar20;
      uVar18 = *(uint *)&paVar15[-1].right - iVar19;
      if (uVar18 < uVar22) goto LAB_0013d9ff;
      local_1f0[local_200].bid = ((long)&(paVar15[-1].left)->parent + uVar20) / uVar21;
      local_1f0[local_200].count = (ulong)uVar18 / (ulong)uVar22;
      uVar20 = local_200 + 1;
      local_1c0 = paVar9;
      if (((ulong)paVar9 & 0xffffffff) <= uVar20) {
        local_1c0 = (avl_node *)(ulong)(uint)((int)paVar9 * 2);
        local_1f0 = (reusable_block *)realloc(local_1f0,(long)local_1c0 << 4);
      }
      if (iVar19 == 0) {
        avl_remove(mergetree,paVar15);
        free(&paVar15[-1].left);
      }
      else {
        *(int *)&paVar15[-1].right = iVar19;
      }
      paVar15 = paVar16;
      if (uVar18 % uVar22 != 0) {
        plVar17 = (long *)calloc(1,0x28);
        *plVar17 = (local_1f0[local_200].count + local_1f0[local_200].bid) * uVar21;
        *(uint *)(plVar17 + 1) = uVar18 % uVar22;
        avl_insert(mergetree,(avl_node *)(plVar17 + 2),_reusable_offset_cmp);
        paVar15 = avl_next((avl_node *)(plVar17 + 2));
      }
      local_200 = uVar20;
      paVar9 = local_1c0;
    } while (paVar15 != (avl_node *)0x0);
  }
LAB_0013db1a:
  fdb_gather_stale_blocks
            (handle,(filemgr_header_revnum_t)local_1c8,0xffffffffffffffff,0xffffffffffffffff,0,
             local_1b8,true);
  free(local_1e8);
LAB_0013db56:
  rVar24.blocks = local_1f0;
  rVar24.n_blocks = local_200;
  return rVar24;
}

Assistant:

reusable_block_list fdb_get_reusable_block(fdb_kvs_handle *handle,
                                           stale_header_info stale_header)
{
    int64_t delta;
    int r;
    uint8_t keybuf[64];
    uint32_t i;
    uint32_t item_len;
    uint32_t n_revnums, max_revnum_array = 256;
    uint64_t item_pos;
    btree_iterator bit;
    btree_result br;
    filemgr_header_revnum_t revnum_upto, prev_revnum = 0;
    filemgr_header_revnum_t revnum = 0, _revnum;
    filemgr_header_revnum_t *revnum_array;
    bid_t offset, _offset, prev_offset;
    bid_t prev_hdr = BLK_NOT_FOUND;
    bool stale_tree_scan = true;
    struct docio_object doc;
    struct avl_tree *mergetree = &handle->file->mergetree;
    struct avl_node *avl;
    struct stale_data *item;
    struct list_elem *e, *e_last;
    struct kvs_stat stat;

    revnum_upto = stale_header.revnum;

    r = _kvs_stat_get(handle->file, 0, &stat);
    handle->bhandle->nlivenodes = stat.nlivenodes;
    handle->bhandle->ndeltanodes = stat.nlivenodes;
    (void)r;

    revnum_array = (filemgr_header_revnum_t *)
                   calloc(max_revnum_array, sizeof(filemgr_header_revnum_t));
    n_revnums = 0;

    // remember the last stale list item to be preserved
    e_last = list_end(handle->file->stale_list);

    avl = avl_first(&handle->file->stale_info_tree);
    if (avl) {
        // if in-memory stale info exists
        void *uncomp_buf = NULL;
        size_t uncomp_buflen = 128*1024; // 128 KB by default;
        struct stale_info_commit *commit;
        struct stale_info_entry *entry;

        stale_tree_scan = false;

        if (compress_inmem_stale_info) {
            uncomp_buf = (void*)calloc(1, uncomp_buflen);
            if (!uncomp_buf) {
                fdb_log(NULL, FDB_LOG_ERROR, FDB_RESULT_ALLOC_FAIL,
                        "(fdb_get_reusable_block) "
                        "calloc of 'uncomp_buf' failed: "
                        "database file '%s', "
                        "uncomp_buflen %d\n",
                        handle->file->filename,
                        (int)uncomp_buflen);
                free(revnum_array);

                reusable_block_list ret;
                ret.n_blocks = 0;
                ret.blocks = NULL;

                return ret;
            }
        }

        while (avl) {
            commit = _get_entry(avl, struct stale_info_commit, avl);
            avl = avl_next(avl);

            prev_revnum = revnum;
            revnum = commit->revnum;
            if (revnum > revnum_upto) {
                revnum = prev_revnum;
                break;
            }

            filemgr_header_revnum_t *new_revnum_array = revnum_array;
            revnum_array[n_revnums++] = revnum;
            if (n_revnums >= max_revnum_array) {
                max_revnum_array *= 2;
                new_revnum_array = (filemgr_header_revnum_t *)
                                   realloc(revnum_array, max_revnum_array *
                                           sizeof(filemgr_header_revnum_t));
            }
            if (!new_revnum_array) {
                // realloc() of revnum_array failed.
                fdb_log(NULL, FDB_LOG_ERROR, FDB_RESULT_ALLOC_FAIL,
                        "(fdb_get_reusable_block) "
                        "realloc of 'revnum_array' failed: "
                        "database file '%s', "
                        "max_revnum_array %d\n",
                        handle->file->filename,
                        (int)max_revnum_array);
                free(uncomp_buf);
                free(revnum_array);

                reusable_block_list ret;
                ret.n_blocks = 0;
                ret.blocks = NULL;

                return ret;
            }
            revnum_array = new_revnum_array;

            avl_remove(&handle->file->stale_info_tree, &commit->avl);

            e = list_begin(&commit->doc_list);
            while (e) {
                entry = _get_entry(e, struct stale_info_entry, le);
                e = list_next(&entry->le);
                list_remove(&commit->doc_list, &entry->le);

                if (entry->ctx) {
#ifdef _DOC_COMP
                    if (compress_inmem_stale_info) {
                        // uncompression
                        void* new_uncomp_buf = uncomp_buf;
                        if (uncomp_buflen < entry->ctxlen) {
                            uncomp_buflen = entry->ctxlen;
                            new_uncomp_buf = (void*)realloc(uncomp_buf, uncomp_buflen);
                        }

                        if (!new_uncomp_buf) {
                            // realloc() of uncomp_buf failed.
                            fdb_log(NULL, FDB_LOG_ERROR, FDB_RESULT_ALLOC_FAIL,
                                    "(fdb_get_reusable_block) "
                                    "realloc of 'uncomp_buf' failed: "
                                    "database file '%s', "
                                    "uncomp_buflen %d, "
                                    "entry->ctxlen %d\n",
                                    handle->file->filename,
                                    (int)uncomp_buflen,
                                    (int)entry->ctxlen);
                            free(uncomp_buf);
                            free(revnum_array);

                            reusable_block_list ret;
                            ret.n_blocks = 0;
                            ret.blocks = NULL;

                            return ret;
                        }
                        uncomp_buf = new_uncomp_buf;

                        size_t len = uncomp_buflen;
                        int r = snappy_uncompress
                                ( (char*)entry->ctx, entry->comp_ctxlen,
                                  (char*)uncomp_buf, &len );
                        if (r != 0) {
                            fdb_log(NULL, FDB_LOG_ERROR, FDB_RESULT_COMPRESSION_FAIL,
                                    "(fdb_get_reusable_block) "
                                    "Uncompression error from a database file '%s'"
                                    ": return value %d, header revnum %" _F64 ", "
                                    "doc offset %" _F64 "\n",
                                    handle->file->filename, r, revnum, entry->offset);
                            free(uncomp_buf);
                            free(revnum_array);

                            reusable_block_list ret;
                            ret.n_blocks = 0;
                            ret.blocks = NULL;

                            return ret;
                        }

                        // fetch the context
                        _fetch_stale_info_doc(uncomp_buf, mergetree,
                                              prev_offset, prev_hdr);
                    } else {
                        _fetch_stale_info_doc(entry->ctx, mergetree,
                                              prev_offset, prev_hdr);
                    }
#else
                    _fetch_stale_info_doc(entry->ctx, mergetree, prev_offset, prev_hdr);
#endif
                }

                // also insert/merge the system doc region
                struct stale_regions sr;

                sr = filemgr_actual_stale_regions(handle->file, entry->offset,
                                                  entry->doclen);

                if (sr.n_regions > 1) {
                    for (i=0; i<sr.n_regions; ++i){
                        _insert_n_merge(mergetree, sr.regions[i].pos, sr.regions[i].len);
                    }
                    free(sr.regions);
                } else {
                    _insert_n_merge(mergetree, sr.region.pos, sr.region.len);
                }

                free(entry->ctx);
                free(entry);
            }

            free(commit);
        }
        free(uncomp_buf);
    }

    if (stale_tree_scan) {
        // scan stale-block tree and get all stale regions
        // corresponding to commit headers whose seq number is
        // equal to or smaller than 'revnum_upto'
        btree_iterator_init(handle->staletree, &bit, NULL);
        do {
            br = btree_next(&bit, (void*)&_revnum, (void*)&_offset);
            btreeblk_end(handle->bhandle);
            if (br != BTREE_RESULT_SUCCESS) {
                break;
            }

            prev_revnum = revnum;
            revnum = _endian_decode(_revnum);
            if (revnum > revnum_upto) {
                revnum = prev_revnum;
                break;
            }

            revnum_array[n_revnums++] = revnum;
            if (n_revnums >= max_revnum_array) {
                max_revnum_array *= 2;
                revnum_array = (filemgr_header_revnum_t *)
                               realloc(revnum_array, max_revnum_array *
                                   sizeof(filemgr_header_revnum_t));
            }
            offset = _endian_decode(_offset);

            while (offset != BLK_NOT_FOUND) {
                memset(&doc, 0x0, sizeof(doc));
                // pre-allocated buffer for key
                doc.key = (void*)keybuf;

                if (docio_read_doc(handle->dhandle, offset, &doc, true) <= 0) {
                    // read fail .. escape
                    offset = BLK_NOT_FOUND;
                    continue;
                }

                _fetch_stale_info_doc(doc.body, mergetree, prev_offset, prev_hdr);

                // also insert/merge the system doc region
                size_t length = _fdb_get_docsize(doc.length);
                struct stale_regions sr;

                sr = filemgr_actual_stale_regions(handle->file, offset, length);

                if (sr.n_regions > 1) {
                    for (i=0; i<sr.n_regions; ++i){
                        _insert_n_merge(mergetree, sr.regions[i].pos, sr.regions[i].len);
                    }
                    free(sr.regions);
                } else {
                    _insert_n_merge(mergetree, sr.region.pos, sr.region.len);
                }

                // We don't need to free 'meta' as it will be NULL.
                free(doc.body);

                offset = prev_offset;
            }
        } while (true);
        btree_iterator_free(&bit);
    }

    // remove merged commit headers
    for (i=0; i<n_revnums; ++i) {
        _revnum = _endian_encode(revnum_array[i]);
        btree_remove(handle->staletree, (void*)&_revnum);
        btreeblk_end(handle->bhandle);
    }

    delta = handle->bhandle->nlivenodes - stat.nlivenodes;
    _kvs_stat_update_attr(handle->file, 0, KVS_STAT_NLIVENODES, delta);
    delta = handle->bhandle->ndeltanodes - stat.nlivenodes;
    delta *= handle->config.blocksize;
    _kvs_stat_update_attr(handle->file, 0, KVS_STAT_DELTASIZE, delta);

    // gather stale blocks generated by removing b+tree entries
    if (e_last) {
        e = list_next(e_last);
    } else {
        e = list_begin(handle->file->stale_list);
    }
    while (e) {
        item = _get_entry(e, struct stale_data, le);
        e = list_remove(handle->file->stale_list, e);

        _insert_n_merge(mergetree, item->pos, item->len);
        free(item);
    }

    // now merge stale regions as large as possible
    size_t n_blocks =0 ;
    size_t blocksize = handle->file->blocksize;
    uint32_t max_blocks = 256;
    uint32_t front_margin;
    reusable_block_list ret;
    struct reusable_block *blocks_arr;

    blocks_arr = (struct reusable_block*)
        calloc(max_blocks, sizeof(struct reusable_block));

    avl = avl_first(mergetree);
    while (avl) {
        item = _get_entry(avl, struct stale_data, avl);
        avl = avl_next(avl);

        // A stale region can be represented as follows:
        //
        //  block x-1 |   block x  |  block x+1 |  block x+2
        //  -----+----+------------+------------+--------+----
        //   ... |  A |      B     |      C     |    D   | ...
        //  -----+----+------------+------------+--------+----
        //
        // Only segment 'B' and 'C' can be reusable, and the other segments
        // (i.e., 'A' and 'D') should be re-inserted into stale-block tree.

        if (item->len < blocksize) {
            // whole region is smaller than a block .. skip this item
            //       |    block    |  ...
            //  -----+---+-----+---+-------
            //   ... |   |/////|   |  ...
            //  -----+---+-----+---+-------
            continue;
        }

        //            <------------ item_len ------------>
        //  block x-1 |   block x  |  block x+1 |  block x+2
        //  -----+----+------------+------------+--------+----
        //   ... |  A |      B     |      C     |    D   | ...
        //  -----+----+------------+------------+--------+----
        //            ^
        //            item_pos
        if (item->pos % blocksize) {
            front_margin = blocksize - item->pos % blocksize;
        } else {
            front_margin = 0;
        }
        item_pos = item->pos + front_margin;
        item_len = item->len - front_margin;

        if (item_len < blocksize) {
            // Remaining length is smaller than a block. This means that there
            // is no reusable block in this region (even though the region size is
            // bigger than a block size) .. skip this item.
            //
            //       |   block x   |  block x+1  | ...
            //  -----+------+------+-------+-----+----
            //   ... |      |//////|///////|     | ...
            //  -----+------+------+-------+-----+----
            continue;
        }

        // calculate # blocks and add to 'blocks'
        blocks_arr[n_blocks].bid = item_pos / blocksize;
        blocks_arr[n_blocks].count = item_len / blocksize;
        n_blocks += 1;
        if (n_blocks >= max_blocks) {
            max_blocks *= 2;
            blocks_arr = (struct reusable_block*)
                realloc(blocks_arr, max_blocks * sizeof(struct reusable_block));
        }

        if (front_margin) {
            // adjust the existing item to indicate 'A' in above example
            item->len = front_margin;
        } else {
            // exactly aligned .. remove this item
            avl_remove(mergetree, &item->avl);
            free(item);
        }

        uint32_t remaining_len;
        remaining_len = item_len % blocksize;
        if (remaining_len) {
            // add a new item for the remaining region ('D' in above example)
            struct stale_data *new_item;
            new_item = (struct stale_data *)
                       calloc(1, sizeof(struct stale_data));
            new_item->pos = (blocks_arr[n_blocks-1].bid + blocks_arr[n_blocks-1].count)
                            * blocksize;
            new_item->len = remaining_len;
            avl_insert(mergetree, &new_item->avl, _reusable_offset_cmp);
            avl = avl_next(&new_item->avl);
        }
    }

    // re-write stale tree using the last revnum as a key
    // in this case, only stale regions newly generated by this function are gathered,
    // and prev_hdr is set to BLK_NOT_FOUND, as corresponding seq numbers are
    // already removed.

    // however, do not remove the remaining items in the merge-tree and continue to
    // merge them in the next block reclaim.
    fdb_gather_stale_blocks(handle, revnum, BLK_NOT_FOUND, BLK_NOT_FOUND,
                            0, e_last, true);

    free(revnum_array);

    ret.n_blocks = n_blocks;
    ret.blocks = blocks_arr;
    return ret;
}